

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

uint256 * ComputeTapleafHash(uint256 *__return_storage_ptr__,uint8_t leaf_version,
                            Span<const_unsigned_char> script)

{
  HashWriter *this;
  long lVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> script_local;
  uint32_t local_90 [26];
  long local_28;
  
  script_local.m_data = script.m_data;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (uint32_t *)&HASHER_TAPLEAF;
  puVar3 = local_90;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    puVar2 = puVar2 + 2;
    puVar3 = puVar3 + 2;
  }
  script_local.m_size = script.m_size;
  ser_writedata8<HashWriter>((HashWriter *)local_90,leaf_version);
  WriteCompactSize<HashWriter>((HashWriter *)local_90,script.m_size);
  this = HashWriter::operator<<((HashWriter *)local_90,&script_local);
  HashWriter::GetSHA256(__return_storage_ptr__,this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 ComputeTapleafHash(uint8_t leaf_version, Span<const unsigned char> script)
{
    return (HashWriter{HASHER_TAPLEAF} << leaf_version << CompactSizeWriter(script.size()) << script).GetSHA256();
}